

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_AbortStream(PaStream *stream)

{
  PaStream *in_RDI;
  PaError result;
  undefined4 local_c;
  
  local_c = PaUtil_ValidateStreamPointer(in_RDI);
  if (local_c == 0) {
    local_c = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x20))(in_RDI);
    if (local_c == 0) {
      local_c = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x18))(in_RDI);
    }
    else if (local_c == 1) {
      local_c = -0x26ff;
    }
  }
  return local_c;
}

Assistant:

PaError Pa_AbortStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_AbortStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = PA_STREAM_INTERFACE(stream)->Abort( stream );
        }
        else if( result == 1 )
        {
            result = paStreamIsStopped;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_AbortStream", result );

    return result;
}